

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloom.cpp
# Opt level: O3

bool __thiscall
CRollingBloomFilter::contains(CRollingBloomFilter *this,Span<const_unsigned_char> vKey)

{
  long lVar1;
  pointer puVar2;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  long in_FS_OFFSET;
  bool bVar7;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->nHashFuncs < 1) {
    bVar7 = true;
  }
  else {
    iVar5 = 0;
    iVar6 = 0;
    do {
      uVar3 = MurmurHash3(this->nTweak + iVar5,vKey);
      puVar2 = (this->data).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar4 = ((ulong)((long)(this->data).
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)puVar2) >> 3 &
              0xffffffff) * (ulong)uVar3 >> 0x1d;
      bVar7 = ((*(ulong *)((long)puVar2 + (uVar4 & 0xfffffffffffffff8 | 8)) |
               *(ulong *)((long)puVar2 + (uVar4 & 0xfffffffffffffff0))) >> ((ulong)uVar3 & 0x3f) & 1
              ) != 0;
      if (!bVar7) break;
      iVar6 = iVar6 + 1;
      iVar5 = iVar5 + -0x45b386b;
    } while (iVar6 < this->nHashFuncs);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar7;
}

Assistant:

bool CRollingBloomFilter::contains(Span<const unsigned char> vKey) const
{
    for (int n = 0; n < nHashFuncs; n++) {
        uint32_t h = RollingBloomHash(n, nTweak, vKey);
        int bit = h & 0x3F;
        uint32_t pos = FastRange32(h, data.size());
        /* If the relevant bit is not set in either data[pos & ~1] or data[pos | 1], the filter does not contain vKey */
        if (!(((data[pos & ~1U] | data[pos | 1]) >> bit) & 1)) {
            return false;
        }
    }
    return true;
}